

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrank_test.cpp
# Opt level: O0

void __thiscall TextRankExtractorTest_Test1_Test::TestBody(TextRankExtractorTest_Test1_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_4;
  size_t topN_2;
  vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
  wordweights_1;
  string res_2;
  string s_2;
  AssertionResult gtest_ar_3;
  size_t topN_1;
  vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
  wordweights;
  string res_1;
  string s_1;
  AssertionResult gtest_ar_2;
  vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
  words_2;
  AssertionResult gtest_ar_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  words_1;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  size_t topN;
  string res;
  string s;
  TextRankExtractor Extractor;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected;
  string *in_stack_fffffffffffffb80;
  vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
  *this_00;
  string *in_stack_fffffffffffffb88;
  int line;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  undefined1 uVar2;
  string *in_stack_fffffffffffffb98;
  Type TVar3;
  TextRankExtractor *in_stack_fffffffffffffba0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  size_t in_stack_fffffffffffffbb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbc0;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  TextRankExtractor *in_stack_fffffffffffffbd0;
  undefined1 *topN_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *keywords;
  string *sentence;
  TextRankExtractor *this_01;
  AssertionResult local_3d8;
  undefined8 local_3c8;
  undefined1 local_3c0 [63];
  undefined1 local_381 [49];
  AssertionResult local_350;
  undefined8 local_340;
  undefined1 local_338 [24];
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [32];
  vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
  *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd30;
  AssertionResult local_2c8 [3];
  AssertionResult local_290;
  undefined1 local_280 [135];
  undefined1 local_1f9 [40];
  undefined1 local_1d1 [40];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [55];
  allocator<char> local_149;
  string local_148 [64];
  size_t in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
  *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  TextRankExtractor *in_stack_ffffffffffffff20;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
             ,(allocator<char> *)in_stack_fffffffffffffba0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
             ,(allocator<char> *)in_stack_fffffffffffffba0);
  this_01 = (TextRankExtractor *)&local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
             ,(allocator<char> *)in_stack_fffffffffffffba0);
  sentence = (string *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
             ,(allocator<char> *)in_stack_fffffffffffffba0);
  cppjieba::TextRankExtractor::TextRankExtractor
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (string *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  TVar3 = (Type)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  keywords = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),in_stack_fffffffffffffba8
             ,(allocator<char> *)in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  std::__cxx11::string::string((string *)(local_280 + 0x60));
  local_280._88_8_ = (_Hash_node_base *)0x5;
  topN_00 = local_280 + 0x40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1dc900);
  cppjieba::TextRankExtractor::Extract
            (in_stack_fffffffffffffbd0,
             (string *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8),
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  std::operator<<(in_stack_fffffffffffffd30,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd28);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[21]>
            ((char *)in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,
             in_stack_fffffffffffffb78,
             (char (*) [21])CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_280 + 0x30));
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1dcae2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,TVar3,
               (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
               (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(char *)in_stack_fffffffffffffb80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffbd0,
               (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    testing::Message::~Message((Message *)0x1dcb3f);
  }
  local_280._29_3_ = 0;
  local_280[0x1c] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcbad);
  if (local_280._28_4_ == 0) {
    local_280._28_4_ = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffb80);
  if (local_280._28_4_ == 0) {
    in_stack_fffffffffffffbd0 = (TextRankExtractor *)local_280;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)0x1dcbf5);
    cppjieba::TextRankExtractor::Extract(this_01,sentence,keywords,(size_t)topN_00);
    std::operator<<(in_stack_fffffffffffffd30,
                    (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     *)in_stack_fffffffffffffd28);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[28]>
              ((char *)in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,
               in_stack_fffffffffffffb78,
               (char (*) [28])CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
    in_stack_fffffffffffffbcf = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffba0);
      testing::AssertionResult::failure_message((AssertionResult *)0x1dcceb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffba0,TVar3,
                 (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                 (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(char *)in_stack_fffffffffffffb80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffbd0,
                 (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      testing::Message::~Message((Message *)0x1dcd48);
    }
    local_280._29_3_ = 0;
    local_280[0x1c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcdb6);
    if (local_280._28_4_ == 0) {
      local_280._28_4_ = 0;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *)in_stack_fffffffffffffb80);
    if (local_280._28_4_ == 0) {
      std::
      vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
      ::vector((vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
                *)0x1dcdfe);
      cppjieba::TextRankExtractor::Extract
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[108]>
                ((char *)in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,
                 in_stack_fffffffffffffb78,
                 (char (*) [108])CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
      in_stack_fffffffffffffbb7 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffba0);
        in_stack_fffffffffffffba8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x1dcf00);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffba0,TVar3,
                   (char *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
                   (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(char *)in_stack_fffffffffffffb80
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffbd0,
                   (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
        testing::Message::~Message((Message *)0x1dcf5d);
      }
      local_280._29_3_ = 0;
      local_280[0x1c] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcfcb);
      if (local_280._28_4_ == 0) {
        local_280._28_4_ = 0;
      }
      std::
      vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
      ::~vector((vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
                 *)in_stack_fffffffffffffb80);
      if (local_280._28_4_ == 0) {
        local_280._28_4_ = 0;
      }
    }
  }
  std::__cxx11::string::~string((string *)(local_280 + 0x60));
  std::__cxx11::string::~string((string *)(local_1f9 + 1));
  if (local_280._28_4_ == 0) {
    __a = &local_2f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
               in_stack_fffffffffffffba8,__a);
    std::allocator<char>::~allocator(&local_2f9);
    std::__cxx11::string::string(local_320);
    TVar3 = (Type)((ulong)local_338 >> 0x20);
    std::
    vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
    ::vector((vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
              *)0x1dd08c);
    local_340 = 5;
    cppjieba::TextRankExtractor::Extract
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[274]>
              ((char *)in_stack_fffffffffffffb88,(char *)in_stack_fffffffffffffb80,
               in_stack_fffffffffffffb78,
               (char (*) [274])CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
    uVar2 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)__a);
      in_stack_fffffffffffffb88 =
           (string *)testing::AssertionResult::failure_message((AssertionResult *)0x1dd1dd);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)__a,TVar3,(char *)CONCAT17(uVar2,in_stack_fffffffffffffb90),
                 (int)((ulong)in_stack_fffffffffffffb88 >> 0x20),(char *)in_stack_fffffffffffffb80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffbd0,
                 (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      testing::Message::~Message((Message *)0x1dd23a);
    }
    local_280._29_3_ = 0;
    local_280[0x1c] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd2a8);
    if (local_280._28_4_ == 0) {
      local_280._28_4_ = 0;
    }
    std::
    vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
    ::~vector((vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
               *)in_stack_fffffffffffffb80);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_2f8);
    if (local_280._28_4_ == 0) {
      this_00 = (vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
                 *)local_381;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
                 in_stack_fffffffffffffba8,__a);
      std::allocator<char>::~allocator((allocator<char> *)local_381);
      std::__cxx11::string::string((string *)(local_3c0 + 0x18));
      expected = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
      std::
      vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
      ::vector((vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
                *)0x1dd351);
      local_3c8 = 5;
      cppjieba::TextRankExtractor::Extract
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::operator<<(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[105]>
                ((char *)in_stack_fffffffffffffb88,(char *)this_00,expected,
                 (char (*) [105])CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
      line = (int)((ulong)in_stack_fffffffffffffb88 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      in_stack_fffffffffffffb77 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)__a);
        testing::AssertionResult::failure_message((AssertionResult *)0x1dd4a2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)__a,TVar3,(char *)CONCAT17(uVar2,in_stack_fffffffffffffb90),line,
                   (char *)this_00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffbd0,
                   (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
        testing::Message::~Message((Message *)0x1dd4fd);
      }
      local_280._29_3_ = 0;
      local_280[0x1c] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd56b);
      if (local_280._28_4_ == 0) {
        local_280._28_4_ = 0;
      }
      std::
      vector<cppjieba::TextRankExtractor::_Word,_std::allocator<cppjieba::TextRankExtractor::_Word>_>
      ::~vector(this_00);
      std::__cxx11::string::~string((string *)(local_3c0 + 0x18));
      std::__cxx11::string::~string((string *)(local_381 + 1));
      if (local_280._28_4_ == 0) {
        local_280._28_4_ = 0;
      }
    }
  }
  cppjieba::TextRankExtractor::~TextRankExtractor
            ((TextRankExtractor *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  return;
}

Assistant:

TEST(TextRankExtractorTest, Test1) {
  TextRankExtractor Extractor(
    "../test/testdata/extra_dict/jieba.dict.small.utf8",
    "../dict/hmm_model.utf8", 
    "../dict/stop_words.utf8");
  {
    string s("你好世界世界而且而且");
    string res;
    size_t topN = 5;

    {
      vector<string> words;
      Extractor.Extract(s, words, topN);
      res << words;
      ASSERT_EQ(res, "[\"世界\", \"你好\"]");
    }

    {
      vector<pair<string, double> > words;
      Extractor.Extract(s, words, topN);
      res << words;
      ASSERT_EQ(res, "[世界:1, 你好:0.519787]");
    }

    {
      vector<TextRankExtractor::Word> words;
      Extractor.Extract(s, words, topN);
      res << words;
      ASSERT_EQ(res, "[{\"word\": \"世界\", \"offset\": [6, 12], \"weight\": 1}, {\"word\": \"你好\", \"offset\": [0], \"weight\": 0.519787}]");
    }
  }

  { 
    string s("\xe6\x88\x91\xe6\x98\xaf\xe6\x8b\x96\xe6\x8b\x89\xe6\x9c\xba\xe5\xad\xa6\xe9\x99\xa2\xe6\x89\x8b\xe6\x89\xb6\xe6\x8b\x96\xe6\x8b\x89\xe6\x9c\xba\xe4\xb8\x93\xe4\xb8\x9a\xe7\x9a\x84\xe3\x80\x82\xe4\xb8\x8d\xe7\x94\xa8\xe5\xa4\x9a\xe4\xb9\x85\xef\xbc\x8c\xe6\x88\x91\xe5\xb0\xb1\xe4\xbc\x9a\xe5\x8d\x87\xe8\x81\x8c\xe5\x8a\xa0\xe8\x96\xaa\xef\xbc\x8c\xe5\xbd\x93\xe4\xb8\x8a CEO\xef\xbc\x8c\xe8\xb5\xb0\xe4\xb8\x8a\xe4\xba\xba\xe7\x94\x9f\xe5\xb7\x85\xe5\xb3\xb0");
    string res;
    vector<TextRankExtractor::Word> wordweights;
    size_t topN = 5;
    Extractor.Extract(s, wordweights, topN);
    res << wordweights;
    ASSERT_EQ(res, "[{\"word\": \"当上\", \"offset\": [87], \"weight\": 1}, {\"word\": \"不用\", \"offset\": [48], \"weight\": 0.989848}, {\"word\": \"多久\", \"offset\": [54], \"weight\": 0.985126}, {\"word\": \"加薪\", \"offset\": [78], \"weight\": 0.983046}, {\"word\": \"升职\", \"offset\": [72], \"weight\": 0.980278}]");
    //ASSERT_EQ(res, "[{\"word\": \"专业\", \"offset\": [36], \"weight\": 1}, {\"word\": \"CEO\", \"offset\": [94], \"weight\": 0.95375}, {\"word\": \"手扶拖拉机\", \"offset\": [21], \"weight\": 0.801701}, {\"word\": \"当上\", \"offset\": [87], \"weight\": 0.798968}, {\"word\": \"走上\", \"offset\": [100], \"weight\": 0.775505}]");
  }

  {
    string s("一部iPhone6");
    string res;
    vector<TextRankExtractor::Word> wordweights;
    size_t topN = 5;
    Extractor.Extract(s, wordweights, topN);
    res << wordweights;
    ASSERT_EQ(res, "[{\"word\": \"一部\", \"offset\": [0], \"weight\": 1}, {\"word\": \"iPhone6\", \"offset\": [6], \"weight\": 0.996126}]");
  }
}